

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_Constructors_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_Constructors_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  hasher hVar4;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int i;
  AssertionResult gtest_ar_1;
  TypeParam ht_iter_fourarg;
  TypeParam ht_iter_threearg;
  TypeParam ht_iter_twoarg;
  TypeParam ht_iter_onearg;
  TypeParam ht_iter_noarg;
  value_type *end;
  value_type *begin;
  int num_inputs;
  value_type input [4];
  int old_alloc_count;
  AssertionResult gtest_ar;
  TypeParam ht_fourarg;
  TypeParam ht_threearg;
  TypeParam ht_twoarg;
  TypeParam ht_onearg;
  TypeParam ht_noarg;
  Alloc<int,_unsigned_long,_18446744073709551615UL> alloc;
  int alloc_count;
  hasher hasher;
  undefined8 in_stack_ffffffffffffefd8;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffefe0;
  key_equal *in_stack_ffffffffffffefe8;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeff0;
  key_equal *in_stack_ffffffffffffeff8;
  int line;
  hasher *in_stack_fffffffffffff000;
  int *in_stack_fffffffffffff008;
  Type type;
  undefined4 in_stack_fffffffffffff010;
  undefined4 in_stack_fffffffffffff014;
  allocator_type *in_stack_fffffffffffff020;
  undefined4 in_stack_fffffffffffff058;
  undefined4 in_stack_fffffffffffff05c;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff060;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d70;
  int local_d60;
  undefined4 local_d5c;
  AssertionResult local_d58 [2];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d38;
  int local_d28;
  undefined4 local_d24;
  AssertionResult local_d20 [2];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d00;
  int local_cf0;
  undefined4 local_cec;
  AssertionResult local_ce8 [2];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_cc8;
  int local_cb8;
  undefined4 local_cb4;
  AssertionResult local_cb0 [2];
  key_equal local_c90;
  key_equal local_c80;
  int local_c70;
  undefined4 local_c6c;
  AssertionResult local_c68 [2];
  hasher local_c48;
  hasher local_c38;
  int local_c28;
  undefined4 local_c24;
  AssertionResult local_c20 [2];
  key_equal local_c00;
  key_equal local_bf0;
  int local_be0;
  undefined4 local_bdc;
  AssertionResult local_bd8 [2];
  hasher local_bb8;
  hasher local_ba8;
  int local_b98;
  undefined4 local_b94;
  AssertionResult local_b90 [2];
  key_equal local_b70;
  key_equal local_b60;
  int local_b50;
  undefined4 local_b4c;
  AssertionResult local_b48 [2];
  hasher local_b28;
  hasher local_b18;
  int local_b08;
  undefined4 local_b04;
  AssertionResult local_b00 [2];
  key_equal local_ae0;
  key_equal local_ad0;
  int local_ac0;
  undefined4 local_abc;
  AssertionResult local_ab8 [2];
  hasher local_a98;
  hasher local_a88;
  int local_a78;
  undefined4 local_a74;
  AssertionResult local_a70 [2];
  key_equal local_a50;
  key_equal local_a40;
  int local_a30;
  undefined4 local_a2c;
  AssertionResult local_a28 [2];
  hasher local_a08;
  hasher local_9f8;
  int local_9e8;
  undefined4 local_9e4;
  AssertionResult local_9e0 [2];
  key_equal local_9c0;
  key_equal local_9b0;
  int local_9a0;
  undefined4 local_99c;
  AssertionResult local_998 [2];
  hasher local_978;
  hasher local_968;
  int local_958;
  undefined4 local_954;
  AssertionResult local_950 [2];
  key_equal local_930;
  key_equal local_920;
  int local_910;
  undefined4 local_90c;
  AssertionResult local_908 [2];
  hasher local_8e8;
  hasher local_8d8;
  int local_8c8;
  undefined4 local_8c4;
  AssertionResult local_8c0 [2];
  key_equal local_8a0;
  key_equal local_890;
  int local_880;
  undefined4 local_87c;
  AssertionResult local_878 [2];
  hasher local_858;
  hasher local_848;
  int local_838;
  undefined4 local_834;
  AssertionResult local_830 [2];
  undefined4 local_80c;
  size_type local_808;
  AssertionResult local_800 [2];
  undefined4 local_7dc;
  size_type local_7d8;
  AssertionResult local_7d0 [2];
  undefined4 local_7ac;
  size_type local_7a8;
  AssertionResult local_7a0 [2];
  undefined4 local_77c;
  size_type local_778;
  AssertionResult local_770 [2];
  undefined4 local_74c;
  size_type local_748;
  AssertionResult local_740 [2];
  undefined4 local_71c;
  size_type local_718;
  AssertionResult local_710 [2];
  AssertionResult local_6f0 [3];
  value_type local_6b8;
  int local_6b4;
  AssertionResult local_6a0 [9];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_610 [9];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_580;
  Hasher local_56c [11];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_4e0;
  Hasher local_4d0;
  Hasher local_4c4 [11];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_438;
  Hasher local_428;
  Hasher local_41c [11];
  undefined1 *local_390;
  value_type *local_388;
  undefined4 local_37c;
  value_type local_378;
  value_type local_374;
  value_type local_370;
  value_type local_36c;
  undefined1 auStack_368 [4];
  int local_364;
  undefined4 local_34c;
  AssertionResult local_348 [9];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_2b8 [9];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_228;
  Hasher local_214 [11];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_188;
  Hasher local_178;
  Hasher local_16c [11];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_e0;
  Hasher local_d0 [2];
  Hasher local_b4 [11];
  undefined1 local_28 [40];
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffefd8 >> 0x20);
  Hasher::Hasher((Hasher *)(local_28 + 0x14),1);
  local_28._16_4_ = 0;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_28,2,
             (int *)(local_28 + 0x10));
  Hasher::Hasher(local_b4,0);
  Hasher::Hasher(local_d0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_e0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),
             (size_type)in_stack_fffffffffffff008,in_stack_fffffffffffff000,
             in_stack_ffffffffffffeff8,(allocator_type *)in_stack_ffffffffffffeff0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_e0);
  Hasher::Hasher(local_16c,0);
  Hasher::Hasher(&local_178,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_188,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),
             (size_type)in_stack_fffffffffffff008,in_stack_fffffffffffff000,
             in_stack_ffffffffffffeff8,(allocator_type *)in_stack_ffffffffffffeff0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_188);
  Hasher::Hasher(local_214,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_228,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),
             (size_type)in_stack_fffffffffffff008,in_stack_fffffffffffff000,
             in_stack_ffffffffffffeff8,(allocator_type *)in_stack_ffffffffffffeff0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_228);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_2b8,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),
             (size_type)in_stack_fffffffffffff008,in_stack_fffffffffffff000,
             in_stack_ffffffffffffeff8,(allocator_type *)in_stack_ffffffffffffeff0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_2b8);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),
             (size_type)in_stack_fffffffffffff008,in_stack_fffffffffffff000,
             in_stack_ffffffffffffeff8,(allocator_type *)in_stack_ffffffffffffeff0);
  local_34c = 1;
  testing::internal::CmpHelperLE<int,int>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_348);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb24f49);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),
               (Type)((ulong)in_stack_fffffffffffff008 >> 0x20),(char *)in_stack_fffffffffffff000,
               (int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),(char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb24fac);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2501d);
  local_364 = local_28._16_4_;
  local_378 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffefe0,iVar3);
  local_374 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffefe0,iVar3);
  local_370 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffefe0,iVar3);
  local_36c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffefe0,iVar3);
  local_37c = 4;
  local_388 = &local_378;
  local_390 = auStack_368;
  Hasher::Hasher(local_41c,0);
  Hasher::Hasher(&local_428,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_438,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,kEmptyInt,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_DenseHashSet<int_const*>
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),
             in_stack_fffffffffffff008,&in_stack_fffffffffffff000->id_,
             (size_type)in_stack_ffffffffffffeff8,(hasher *)in_stack_ffffffffffffeff0,
             in_stack_ffffffffffffefe8,in_stack_fffffffffffff020);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_438);
  Hasher::Hasher(local_4c4,0);
  Hasher::Hasher(&local_4d0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_4e0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,kEmptyInt,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_DenseHashSet<int_const*>
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),
             in_stack_fffffffffffff008,&in_stack_fffffffffffff000->id_,
             (size_type)in_stack_ffffffffffffeff8,(hasher *)in_stack_ffffffffffffeff0,
             in_stack_ffffffffffffefe8,in_stack_fffffffffffff020);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_4e0);
  Hasher::Hasher(local_56c,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_580,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,kEmptyInt,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_DenseHashSet<int_const*>
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),
             in_stack_fffffffffffff008,&in_stack_fffffffffffff000->id_,
             (size_type)in_stack_ffffffffffffeff8,(hasher *)in_stack_ffffffffffffeff0,
             in_stack_ffffffffffffefe8,in_stack_fffffffffffff020);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_580);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_610,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,kEmptyInt,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_DenseHashSet<int_const*>
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),
             in_stack_fffffffffffff008,&in_stack_fffffffffffff000->id_,
             (size_type)in_stack_ffffffffffffeff8,(hasher *)in_stack_ffffffffffffeff0,
             in_stack_ffffffffffffefe8,in_stack_fffffffffffff020);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_610);
  this_00 = (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)local_28;
  google::
  HashtableInterface_DenseHashSet<int,kEmptyInt,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_DenseHashSet<int_const*>
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),
             in_stack_fffffffffffff008,&in_stack_fffffffffffff000->id_,
             (size_type)in_stack_ffffffffffffeff8,(hasher *)in_stack_ffffffffffffeff0,
             in_stack_ffffffffffffefe8,in_stack_fffffffffffff020);
  testing::internal::CmpHelperGT<int,int>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6a0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb25556);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),
               (Type)((ulong)in_stack_fffffffffffff008 >> 0x20),(char *)in_stack_fffffffffffff000,
               (int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),(char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb255b9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2562a);
  local_364 = local_28._16_4_;
  for (local_6b4 = 2; type = (Type)((ulong)in_stack_fffffffffffff008 >> 0x20), local_6b4 < 2000;
      local_6b4 = local_6b4 + 1) {
    local_6b8 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_ffffffffffffefe0,(int)((ulong)this_00 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff060,
             (value_type *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
  }
  testing::internal::CmpHelperGT<int,int>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6f0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb25722);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb25785);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb257f6);
  local_718 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb25803);
  local_71c = 100;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             (unsigned_long *)in_stack_ffffffffffffefe8,(uint *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_710);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb2589b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb258fe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2596f);
  local_748 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb2597c);
  local_74c = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             (unsigned_long *)in_stack_ffffffffffffefe8,(uint *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_740);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb25a14);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb25a77);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb25ae8);
  local_778 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb25af5);
  local_77c = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             (unsigned_long *)in_stack_ffffffffffffefe8,(uint *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_770);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb25b8d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb25bf0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb25c61);
  local_7a8 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb25c6e);
  local_7ac = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             (unsigned_long *)in_stack_ffffffffffffefe8,(uint *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7a0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb25d06);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb25d69);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb25dda);
  local_7d8 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb25de7);
  local_7dc = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             (unsigned_long *)in_stack_ffffffffffffefe8,(uint *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7d0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb25e7f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb25ee2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb25f53);
  local_808 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb25f60);
  local_80c = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             (unsigned_long *)in_stack_ffffffffffffefe8,(uint *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_800);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb25ff8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb2605b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb260cc);
  local_834 = 0;
  local_858 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffeff0);
  local_848 = local_858;
  local_838 = Hasher::id(&local_848);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_830);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb261b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb2621b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2628c);
  local_87c = 0;
  local_8a0 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffeff0);
  local_890 = local_8a0;
  local_880 = Hasher::id(&local_890);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_878);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb26378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb263db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2644c);
  local_8c4 = 0;
  local_8e8 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffeff0);
  local_8d8 = local_8e8;
  local_8c8 = Hasher::id(&local_8d8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8c0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb26538);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb2659b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2660c);
  local_90c = 0;
  local_930 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffeff0);
  local_920 = local_930;
  local_910 = Hasher::id(&local_920);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_908);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb266f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb2675b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb267cc);
  local_954 = 1;
  local_978 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffeff0);
  local_968 = local_978;
  local_958 = Hasher::id(&local_968);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_950);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb268b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb2691b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2698c);
  local_99c = 0;
  local_9c0 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffeff0);
  local_9b0 = local_9c0;
  local_9a0 = Hasher::id(&local_9b0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_998);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb26a78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb26adb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb26b4c);
  local_9e4 = 1;
  local_a08 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffeff0);
  local_9f8 = local_a08;
  local_9e8 = Hasher::id(&local_9f8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_9e0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb26c38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb26c9b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb26d0c);
  local_a2c = 1;
  local_a50 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffeff0);
  local_a40 = local_a50;
  local_a30 = Hasher::id(&local_a40);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a28);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb26df8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb26e5b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb26ecc);
  local_a74 = 0;
  local_a98 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffeff0);
  local_a88 = local_a98;
  local_a78 = Hasher::id(&local_a88);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a70);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb26fb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb2701b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2708c);
  local_abc = 0;
  local_ae0 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffeff0);
  local_ad0 = local_ae0;
  local_ac0 = Hasher::id(&local_ad0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_ab8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb27178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb271db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2724c);
  local_b04 = 0;
  local_b28 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffeff0);
  local_b18 = local_b28;
  local_b08 = Hasher::id(&local_b18);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b00);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb27338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb2739b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2740c);
  local_b4c = 0;
  local_b70 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffeff0);
  local_b60 = local_b70;
  local_b50 = Hasher::id(&local_b60);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b48);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb274f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Message *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb2755b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb275cc);
  local_b94 = 1;
  hVar4 = google::
          BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::hash_funct(in_stack_ffffffffffffeff0);
  local_bb8 = hVar4;
  local_ba8 = hVar4;
  local_b98 = Hasher::id(&local_ba8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b90);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb276b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              (hVar4._0_8_,(Message *)CONCAT44(hVar4.num_compares_,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb27715);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb27786);
  local_bdc = 0;
  local_c00 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffeff0);
  local_bf0 = local_c00;
  local_be0 = Hasher::id(&local_bf0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_bd8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb27866);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              (hVar4._0_8_,(Message *)CONCAT44(hVar4.num_compares_,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb278c3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb27934);
  local_c24 = 1;
  local_c48 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffeff0);
  local_c38 = local_c48;
  local_c28 = Hasher::id(&local_c38);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c20);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb27a14);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              (hVar4._0_8_,(Message *)CONCAT44(hVar4.num_compares_,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb27a71);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb27ae2);
  local_c6c = 1;
  local_c90 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffeff0);
  iVar3 = local_c90.num_compares_;
  local_c80 = local_c90;
  local_c70 = Hasher::id(&local_c80);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c68);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(iVar3,in_stack_fffffffffffff010));
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xb27bc2);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(iVar3,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              (hVar4._0_8_,(Message *)CONCAT44(hVar4.num_compares_,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb27c1f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb27c90);
  local_cb4 = 0;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator(this_00);
  local_cb8 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(&local_cc8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_cc8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_cb0);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(iVar3,in_stack_fffffffffffff010));
    in_stack_fffffffffffff000 =
         (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0xb27d6c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(iVar3,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              (hVar4._0_8_,(Message *)CONCAT44(hVar4.num_compares_,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb27dc9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb27e3a);
  local_cec = 0;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator(this_00);
  local_cf0 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(&local_d00);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_d00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_ce8);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(iVar3,in_stack_fffffffffffff010));
    in_stack_ffffffffffffeff8 =
         (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0xb27f16);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(iVar3,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              (hVar4._0_8_,(Message *)CONCAT44(hVar4.num_compares_,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb27f73);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb27fe4);
  local_d24 = 2;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator(this_00);
  local_d28 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(&local_d38);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_d38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d20);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(iVar3,in_stack_fffffffffffff010));
    in_stack_ffffffffffffeff0 =
         (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xb280c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(iVar3,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
               (char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              (hVar4._0_8_,(Message *)CONCAT44(hVar4.num_compares_,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb2811d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2818e);
  local_d5c = 2;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator(this_00);
  local_d60 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(&local_d70);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0,
             &in_stack_ffffffffffffefe8->id_,(int *)in_stack_ffffffffffffefe0);
  line = (int)((ulong)in_stack_ffffffffffffeff8 >> 0x20);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_d70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d58);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(iVar3,in_stack_fffffffffffff010));
    testing::AssertionResult::failure_message((AssertionResult *)0xb2826a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(iVar3,in_stack_fffffffffffff010),type,
               (char *)in_stack_fffffffffffff000,line,(char *)in_stack_ffffffffffffeff0);
    testing::internal::AssertHelper::operator=
              (hVar4._0_8_,(Message *)CONCAT44(hVar4.num_compares_,in_stack_fffffffffffff058));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffefe0);
    testing::Message::~Message((Message *)0xb282c7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb28338);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb28345);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb28352);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb2835f);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb2836c);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb28379);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb28386);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb28393);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb283a0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb283ad);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb283ba);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_28);
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, Constructors) {
  // The key/value types don't matter here, so I just test on one set
  // of tables, the ones with int keys, which can easily handle the
  // placement-news we have to do below.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  int alloc_count = 0;
  Alloc<typename TypeParam::key_type> alloc(2, &alloc_count);

  TypeParam ht_noarg;
  TypeParam ht_onearg(100);
  TypeParam ht_twoarg(100, hasher);
  TypeParam ht_threearg(100, hasher, hasher);  // hasher serves as key_equal too
  TypeParam ht_fourarg(100, hasher, hasher, alloc);

  // The allocator should have been called at most once, for the last ht.
  EXPECT_LE(1, alloc_count);
  int old_alloc_count = alloc_count;

  const typename TypeParam::value_type input[] = {
      this->UniqueObject(1), this->UniqueObject(2), this->UniqueObject(4),
      this->UniqueObject(8)};
  const int num_inputs = sizeof(input) / sizeof(input[0]);
  const typename TypeParam::value_type* begin = &input[0];
  const typename TypeParam::value_type* end = begin + num_inputs;
  TypeParam ht_iter_noarg(begin, end);
  TypeParam ht_iter_onearg(begin, end, 100);
  TypeParam ht_iter_twoarg(begin, end, 100, hasher);
  TypeParam ht_iter_threearg(begin, end, 100, hasher, hasher);
  TypeParam ht_iter_fourarg(begin, end, 100, hasher, hasher, alloc);
  // Now the allocator should have been called more.
  EXPECT_GT(alloc_count, old_alloc_count);
  old_alloc_count = alloc_count;

  // Let's do a lot more inserting and make sure the alloc-count goes up
  for (int i = 2; i < 2000; i++) ht_fourarg.insert(this->UniqueObject(i));
  EXPECT_GT(alloc_count, old_alloc_count);

  EXPECT_LT(ht_noarg.bucket_count(), 100u);
  EXPECT_GE(ht_onearg.bucket_count(), 100u);
  EXPECT_GE(ht_twoarg.bucket_count(), 100u);
  EXPECT_GE(ht_threearg.bucket_count(), 100u);
  EXPECT_GE(ht_fourarg.bucket_count(), 100u);
  EXPECT_GE(ht_iter_onearg.bucket_count(), 100u);

  // When we pass in a hasher -- it can serve both as the hash-function
  // and the key-equal function -- its id should be 1.  Where we don't
  // pass it in and use the default Hasher object, the id should be 0.
  EXPECT_EQ(0, ht_noarg.hash_funct().id());
  EXPECT_EQ(0, ht_noarg.key_eq().id());
  EXPECT_EQ(0, ht_onearg.hash_funct().id());
  EXPECT_EQ(0, ht_onearg.key_eq().id());
  EXPECT_EQ(1, ht_twoarg.hash_funct().id());
  EXPECT_EQ(0, ht_twoarg.key_eq().id());
  EXPECT_EQ(1, ht_threearg.hash_funct().id());
  EXPECT_EQ(1, ht_threearg.key_eq().id());

  EXPECT_EQ(0, ht_iter_noarg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_noarg.key_eq().id());
  EXPECT_EQ(0, ht_iter_onearg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_onearg.key_eq().id());
  EXPECT_EQ(1, ht_iter_twoarg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_twoarg.key_eq().id());
  EXPECT_EQ(1, ht_iter_threearg.hash_funct().id());
  EXPECT_EQ(1, ht_iter_threearg.key_eq().id());

  // Likewise for the allocator
  EXPECT_EQ(0, ht_threearg.get_allocator().id());
  EXPECT_EQ(0, ht_iter_threearg.get_allocator().id());
  EXPECT_EQ(2, ht_fourarg.get_allocator().id());
  EXPECT_EQ(2, ht_iter_fourarg.get_allocator().id());
}